

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartApi.cpp
# Opt level: O1

void anon_unknown.dwarf_1ee5cf::fillPixels<half>(Array2D<half> *ph,int width,int height)

{
  short sVar1;
  long lVar2;
  unsigned_short uVar3;
  long lVar4;
  half *phVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  float fVar9;
  uint local_4c;
  
  lVar4 = (long)height * (long)width;
  uVar6 = 0xffffffffffffffff;
  if (-1 < lVar4) {
    uVar6 = lVar4 * 2;
  }
  phVar5 = (half *)operator_new__(uVar6);
  if (ph->_data != (half *)0x0) {
    operator_delete__(ph->_data);
  }
  ph->_sizeX = (long)height;
  ph->_sizeY = (long)width;
  ph->_data = phVar5;
  if (0 < height) {
    lVar4 = 0;
    local_4c = 0;
    uVar6 = 0;
    do {
      if (0 < width) {
        uVar7 = 0;
        uVar8 = local_4c;
        do {
          fVar9 = (float)(uVar8 % 0x801);
          lVar2 = ph->_sizeY;
          phVar5 = ph->_data;
          if (uVar8 % 0x801 == 0) {
            uVar3 = (unsigned_short)((uint)fVar9 >> 0x10);
          }
          else {
            sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar9 >> 0x17) * 2);
            if (sVar1 == 0) {
              uVar3 = half::convert((int)fVar9);
            }
            else {
              uVar3 = sVar1 + (short)(((uint)fVar9 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          *(unsigned_short *)((long)&phVar5[uVar7]._h + lVar2 * lVar4) = uVar3;
          uVar7 = uVar7 + 1;
          uVar8 = uVar8 + 1;
        } while ((uint)width != uVar7);
      }
      uVar6 = uVar6 + 1;
      local_4c = local_4c + width;
      lVar4 = lVar4 + 2;
    } while (uVar6 != (uint)height);
  }
  return;
}

Assistant:

void fillPixels (Array2D<T> &ph, int width, int height)
{
    ph.resizeErase(height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            //
            // We do this because half cannot store number bigger than 2048 exactly.
            //
            ph[y][x] = (y * width + x) % 2049;
        }
}